

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O2

void __thiscall
cppcms::impl::
io_handler_binder_p0<void_(cppcms::impl::tcp_pipe::*)(const_std::error_code_&,_unsigned_long),_std::shared_ptr<cppcms::impl::tcp_pipe>_>
::io_handler_binder_p0
          (io_handler_binder_p0<void_(cppcms::impl::tcp_pipe::*)(const_std::error_code_&,_unsigned_long),_std::shared_ptr<cppcms::impl::tcp_pipe>_>
           *this,offset_in_tcp_pipe_to_subr *f,shared_ptr<cppcms::impl::tcp_pipe> *s)

{
  offset_in_tcp_pipe_to_subr oVar1;
  
  booster::callable<void_(const_std::error_code_&,_unsigned_long)>::callable
            (&this->super_callable_type);
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__io_handler_binder_p0_002b70b0;
  oVar1 = f[1];
  this->f_ = *f;
  *(offset_in_tcp_pipe_to_subr *)&this->field_0x18 = oVar1;
  std::__shared_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->s_).super___shared_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>,
             &s->super___shared_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

io_handler_binder_p0(F const &f,S const &s) : f_(f), s_(s) {}